

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_shift.hpp
# Opt level: O2

void __thiscall trng::lcg64_shift::split(lcg64_shift *this,uint s,uint n)

{
  result_type rVar1;
  result_type extraout_RAX;
  double __x;
  double in_XMM1_Qa;
  invalid_argument local_30 [16];
  
  if (s <= n) {
    std::invalid_argument::invalid_argument
              (local_30,"invalid argument for trng::lcg64_shift::split");
    utility::throw_this<std::invalid_argument>(local_30);
    std::invalid_argument::~invalid_argument(local_30);
  }
  if (1 < s) {
    jump(this,(ulong)n + 1);
    rVar1 = f((ulong)s,(this->P).a);
    (this->P).b = rVar1 * (this->P).b;
    pow(__x,in_XMM1_Qa);
    (this->P).a = extraout_RAX;
    backward(this);
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void lcg64_shift::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(
          std::invalid_argument("invalid argument for trng::lcg64_shift::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      P.b *= f(s, P.a);
      P.a = pow(P.a, s);
      backward();
    }
  }